

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O0

DS_STATUS ds_stack_pop(DsStack *stack,void **data)

{
  int iVar1;
  void **data_local;
  DsStack *stack_local;
  
  if (stack == (DsStack *)0x0) {
    stack_local._4_4_ = DS_STATUS_NULL;
  }
  else if (stack->index < 1) {
    stack_local._4_4_ = DS_STATUS_EMPTY;
  }
  else {
    if (data != (void **)0x0) {
      iVar1 = stack->index + -1;
      stack->index = iVar1;
      *data = stack->elems[iVar1];
    }
    stack_local._4_4_ = DS_STATUS_OK;
  }
  return stack_local._4_4_;
}

Assistant:

DS_STATUS ds_stack_pop(DsStack *stack, void **data)
{
    if (NULL == stack)
        return DS_STATUS_NULL;
    if (stack->index <= 0)
        return DS_STATUS_EMPTY;
    if (data)
        *data = stack->elems[--stack->index];
    return DS_STATUS_OK;
}